

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warnings.cpp
# Opt level: O0

void __thiscall node::Warnings::Warnings(Warnings *this)

{
  long lVar1;
  ConstevalStringLiteral str;
  long in_FS_OFFSET;
  pair<const_std::variant<kernel::Warning,_node::Warning>,_bilingual_str> *in_stack_ffffffffffffff08
  ;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  pair<const_std::variant<kernel::Warning,_node::Warning>,_bilingual_str> *in_stack_ffffffffffffff18
  ;
  undefined4 in_stack_ffffffffffffff58;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AnnotatedMixin<std::mutex>::AnnotatedMixin
            ((AnnotatedMixin<std::mutex> *)in_stack_ffffffffffffff08);
  std::
  map<std::variant<kernel::Warning,_node::Warning>,_bilingual_str,_std::less<std::variant<kernel::Warning,_node::Warning>_>,_std::allocator<std::pair<const_std::variant<kernel::Warning,_node::Warning>,_bilingual_str>_>_>
  ::map((map<std::variant<kernel::Warning,_node::Warning>,_bilingual_str,_std::less<std::variant<kernel::Warning,_node::Warning>_>,_std::allocator<std::pair<const_std::variant<kernel::Warning,_node::Warning>,_bilingual_str>_>_>
         *)in_stack_ffffffffffffff08);
  str.lit._4_4_ = 1;
  str.lit._0_4_ = in_stack_ffffffffffffff58;
  ::_(str);
  std::pair<const_std::variant<kernel::Warning,_node::Warning>,_bilingual_str>::
  pair<node::Warning,_bilingual_str,_true>
            (in_stack_ffffffffffffff18,
             (Warning *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
             (bilingual_str *)in_stack_ffffffffffffff08);
  std::
  map<std::variant<kernel::Warning,_node::Warning>,_bilingual_str,_std::less<std::variant<kernel::Warning,_node::Warning>_>,_std::allocator<std::pair<const_std::variant<kernel::Warning,_node::Warning>,_bilingual_str>_>_>
  ::insert((map<std::variant<kernel::Warning,_node::Warning>,_bilingual_str,_std::less<std::variant<kernel::Warning,_node::Warning>_>,_std::allocator<std::pair<const_std::variant<kernel::Warning,_node::Warning>,_bilingual_str>_>_>
            *)in_stack_ffffffffffffff18,
           (value_type *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
  std::pair<const_std::variant<kernel::Warning,_node::Warning>,_bilingual_str>::~pair
            (in_stack_ffffffffffffff08);
  bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffff08);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Warnings::Warnings()
{
    // Pre-release build warning
    if (!CLIENT_VERSION_IS_RELEASE) {
        m_warnings.insert(
            {Warning::PRE_RELEASE_TEST_BUILD,
             _("This is a pre-release test build - use at your own risk - do not use for mining or merchant applications")});
    }
}